

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.h
# Opt level: O1

LBBox3fa * __thiscall
embree::avx2::GridMeshISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,GridMeshISA *this,size_t buildID,BBox1f *time_range,
          SubGridBuildData *sgrids)

{
  float fVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  undefined1 (*pauVar8) [16];
  int iVar9;
  int iVar10;
  ushort uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ushort uVar19;
  ulong uVar20;
  ulong uVar21;
  BufferView<embree::Vec3fa> *pBVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar31;
  undefined1 auVar29 [16];
  float fVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar41;
  float fVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  
  uVar20 = (ulong)sgrids[buildID].sx & 0x7fff;
  uVar12 = (ulong)sgrids[buildID].sy & 0x7fff;
  lVar4 = *(long *)&(this->super_GridMesh).super_Geometry.field_0x58;
  lVar18 = (ulong)sgrids[buildID].primID * *(long *)&(this->super_GridMesh).field_0x68;
  fVar1 = (this->super_GridMesh).super_Geometry.fnumTimeSegments;
  fVar24 = (this->super_GridMesh).super_Geometry.time_range.lower;
  fVar54 = (this->super_GridMesh).super_Geometry.time_range.upper - fVar24;
  fVar33 = (time_range->lower - fVar24) / fVar54;
  fVar54 = (time_range->upper - fVar24) / fVar54;
  fVar24 = fVar1 * fVar33;
  fVar25 = fVar1 * fVar54;
  auVar45 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),9);
  auVar49 = vroundss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),10);
  auVar38._0_12_ = ZEXT812(0);
  auVar38._12_4_ = 0;
  auVar38 = vmaxss_avx(auVar45,auVar38);
  fVar31 = auVar38._0_4_;
  iVar6 = (int)fVar31;
  iVar9 = -1;
  if (-1 < (int)auVar45._0_4_) {
    iVar9 = (int)auVar45._0_4_;
  }
  iVar10 = (int)fVar1 + 1;
  if ((int)auVar49._0_4_ < (int)fVar1 + 1) {
    iVar10 = (int)auVar49._0_4_;
  }
  auVar38 = vminss_avx(auVar49,ZEXT416((uint)fVar1));
  uVar2 = *(ushort *)(lVar4 + 10 + lVar18);
  uVar21 = (ulong)uVar2;
  if (uVar12 + 3 < (ulong)uVar2) {
    uVar21 = uVar12 + 3;
  }
  auVar29._8_4_ = 0xff800000;
  auVar29._0_8_ = 0xff800000ff800000;
  auVar29._12_4_ = 0xff800000;
  auVar39._8_4_ = 0x7f800000;
  auVar39._0_8_ = 0x7f8000007f800000;
  auVar39._12_4_ = 0x7f800000;
  uVar11 = (ushort)uVar12;
  uVar19 = (ushort)uVar20;
  auVar45 = auVar29;
  auVar49 = auVar39;
  if (uVar11 < uVar2) {
    uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
    uVar16 = (ulong)uVar3;
    if (uVar20 + 3 < (ulong)uVar3) {
      uVar16 = uVar20 + 3;
    }
    pBVar22 = (this->super_GridMesh).vertices.items + iVar6;
    auVar50 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
    bVar23 = true;
    auVar62._8_4_ = 0xddccb9a2;
    auVar62._0_8_ = 0xddccb9a2ddccb9a2;
    auVar62._12_4_ = 0xddccb9a2;
    auVar66._8_4_ = 0x5dccb9a2;
    auVar66._0_8_ = 0x5dccb9a25dccb9a2;
    auVar66._12_4_ = 0x5dccb9a2;
    uVar13 = uVar12;
    do {
      if (uVar19 < uVar3) {
        sVar5 = (pBVar22->super_RawBufferView).stride;
        pauVar8 = (undefined1 (*) [16])
                  ((pBVar22->super_RawBufferView).ptr_ofs +
                  (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar13) *
                  sVar5);
        lVar17 = uVar16 - uVar20;
        do {
          auVar49 = auVar50._0_16_;
          auVar45 = auVar46._0_16_;
          auVar63 = *pauVar8;
          auVar67 = vcmpps_avx(auVar63,auVar62,6);
          auVar70 = vcmpps_avx(auVar63,auVar66,1);
          auVar67 = vandps_avx(auVar70,auVar67);
          uVar15 = vmovmskps_avx(auVar67);
          if ((~(byte)uVar15 & 7) != 0) {
            if (bVar23) {
              auVar45._8_4_ = 0xff800000;
              auVar45._0_8_ = 0xff800000ff800000;
              auVar45._12_4_ = 0xff800000;
              auVar49._8_4_ = 0x7f800000;
              auVar49._0_8_ = 0x7f8000007f800000;
              auVar49._12_4_ = 0x7f800000;
            }
            goto LAB_01a4db07;
          }
          auVar49 = vminps_avx(auVar49,auVar63);
          auVar50 = ZEXT1664(auVar49);
          auVar45 = vmaxps_avx(auVar45,auVar63);
          auVar46 = ZEXT1664(auVar45);
          pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
      auVar49 = auVar50._0_16_;
      auVar45 = auVar46._0_16_;
      uVar13 = uVar13 + 1;
      bVar23 = uVar13 < uVar21;
    } while (uVar13 != uVar21);
  }
LAB_01a4db07:
  fVar32 = auVar38._0_4_;
  iVar7 = (int)fVar32;
  if (uVar11 < uVar2) {
    uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
    uVar16 = (ulong)uVar3;
    if (uVar20 + 3 < (ulong)uVar3) {
      uVar16 = uVar20 + 3;
    }
    pBVar22 = (this->super_GridMesh).vertices.items + iVar7;
    auVar50 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
    auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
    bVar23 = true;
    auVar63._8_4_ = 0xddccb9a2;
    auVar63._0_8_ = 0xddccb9a2ddccb9a2;
    auVar63._12_4_ = 0xddccb9a2;
    auVar67._8_4_ = 0x5dccb9a2;
    auVar67._0_8_ = 0x5dccb9a25dccb9a2;
    auVar67._12_4_ = 0x5dccb9a2;
    uVar13 = uVar12;
    do {
      if (uVar19 < uVar3) {
        sVar5 = (pBVar22->super_RawBufferView).stride;
        pauVar8 = (undefined1 (*) [16])
                  ((pBVar22->super_RawBufferView).ptr_ofs +
                  (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar13) *
                  sVar5);
        lVar17 = uVar16 - uVar20;
        do {
          auVar29 = auVar46._0_16_;
          auVar39 = auVar50._0_16_;
          auVar38 = *pauVar8;
          auVar62 = vcmpps_avx(auVar38,auVar63,6);
          auVar66 = vcmpps_avx(auVar38,auVar67,1);
          auVar62 = vandps_avx(auVar66,auVar62);
          uVar15 = vmovmskps_avx(auVar62);
          if ((~(byte)uVar15 & 7) != 0) {
            if (bVar23) {
              auVar29._8_4_ = 0xff800000;
              auVar29._0_8_ = 0xff800000ff800000;
              auVar29._12_4_ = 0xff800000;
              auVar39._8_4_ = 0x7f800000;
              auVar39._0_8_ = 0x7f8000007f800000;
              auVar39._12_4_ = 0x7f800000;
            }
            goto LAB_01a4dbda;
          }
          auVar39 = vminps_avx(auVar39,auVar38);
          auVar50 = ZEXT1664(auVar39);
          auVar38 = vmaxps_avx(auVar29,auVar38);
          auVar46 = ZEXT1664(auVar38);
          pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
          lVar17 = lVar17 + -1;
        } while (lVar17 != 0);
      }
      auVar29 = auVar46._0_16_;
      auVar39 = auVar50._0_16_;
      uVar13 = uVar13 + 1;
      bVar23 = uVar13 < uVar21;
    } while (uVar13 != uVar21);
  }
LAB_01a4dbda:
  if (iVar10 - iVar9 == 1) {
    auVar38 = vmaxss_avx(ZEXT416((uint)(fVar24 - fVar31)),ZEXT816(0) << 0x40);
    fVar24 = auVar38._0_4_;
    fVar1 = 1.0 - fVar24;
    auVar60._0_4_ = fVar24 * auVar39._0_4_;
    auVar60._4_4_ = fVar24 * auVar39._4_4_;
    auVar60._8_4_ = fVar24 * auVar39._8_4_;
    auVar60._12_4_ = fVar24 * auVar39._12_4_;
    auVar59._4_4_ = fVar1;
    auVar59._0_4_ = fVar1;
    auVar59._8_4_ = fVar1;
    auVar59._12_4_ = fVar1;
    aVar40 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar60,auVar59,auVar49);
    auVar26._0_4_ = fVar24 * auVar29._0_4_;
    auVar26._4_4_ = fVar24 * auVar29._4_4_;
    auVar26._8_4_ = fVar24 * auVar29._8_4_;
    auVar26._12_4_ = fVar24 * auVar29._12_4_;
    aVar30 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar26,auVar45,auVar59);
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar40;
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar30;
    auVar38 = vmaxss_avx(ZEXT416((uint)(fVar32 - fVar25)),ZEXT816(0) << 0x40);
    fVar24 = auVar38._0_4_;
    fVar1 = 1.0 - fVar24;
    auVar47._0_4_ = fVar24 * auVar49._0_4_;
    auVar47._4_4_ = fVar24 * auVar49._4_4_;
    auVar47._8_4_ = fVar24 * auVar49._8_4_;
    auVar47._12_4_ = fVar24 * auVar49._12_4_;
    auVar34._4_4_ = fVar1;
    auVar34._0_4_ = fVar1;
    auVar34._8_4_ = fVar1;
    auVar34._12_4_ = fVar1;
    aVar40 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar39,auVar34,auVar47);
    auVar27._0_4_ = fVar24 * auVar45._0_4_;
    auVar27._4_4_ = fVar24 * auVar45._4_4_;
    auVar27._8_4_ = fVar24 * auVar45._8_4_;
    auVar27._12_4_ = fVar24 * auVar45._12_4_;
    aVar30 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar29,auVar34,auVar27);
  }
  else {
    auVar64._8_4_ = 0xff800000;
    auVar64._0_8_ = 0xff800000ff800000;
    auVar64._12_4_ = 0xff800000;
    auVar68._8_4_ = 0x7f800000;
    auVar68._0_8_ = 0x7f8000007f800000;
    auVar68._12_4_ = 0x7f800000;
    auVar70 = auVar64;
    auVar72 = auVar68;
    if (uVar11 < uVar2) {
      uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
      uVar16 = (ulong)uVar3;
      if (uVar20 + 3 < (ulong)uVar3) {
        uVar16 = uVar20 + 3;
      }
      pBVar22 = (this->super_GridMesh).vertices.items;
      auVar50 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      bVar23 = true;
      auVar73._8_4_ = 0xddccb9a2;
      auVar73._0_8_ = 0xddccb9a2ddccb9a2;
      auVar73._12_4_ = 0xddccb9a2;
      auVar51._8_4_ = 0x5dccb9a2;
      auVar51._0_8_ = 0x5dccb9a25dccb9a2;
      auVar51._12_4_ = 0x5dccb9a2;
      uVar13 = uVar12;
      do {
        if (uVar19 < uVar3) {
          sVar5 = pBVar22[(long)iVar6 + 1].super_RawBufferView.stride;
          pauVar8 = (undefined1 (*) [16])
                    (pBVar22[(long)iVar6 + 1].super_RawBufferView.ptr_ofs +
                    (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar13) *
                    sVar5);
          lVar17 = uVar16 - uVar20;
          do {
            auVar72 = auVar50._0_16_;
            auVar70 = auVar46._0_16_;
            auVar38 = *pauVar8;
            auVar62 = vcmpps_avx(auVar38,auVar73,6);
            auVar66 = vcmpps_avx(auVar38,auVar51,1);
            auVar62 = vandps_avx(auVar66,auVar62);
            uVar15 = vmovmskps_avx(auVar62);
            if ((~(byte)uVar15 & 7) != 0) {
              if (bVar23) {
                auVar70._8_4_ = 0xff800000;
                auVar70._0_8_ = 0xff800000ff800000;
                auVar70._12_4_ = 0xff800000;
                auVar72._8_4_ = 0x7f800000;
                auVar72._0_8_ = 0x7f8000007f800000;
                auVar72._12_4_ = 0x7f800000;
              }
              goto LAB_01a4dd4a;
            }
            auVar62 = vminps_avx(auVar72,auVar38);
            auVar50 = ZEXT1664(auVar62);
            auVar38 = vmaxps_avx(auVar70,auVar38);
            auVar46 = ZEXT1664(auVar38);
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
        }
        auVar72 = auVar50._0_16_;
        auVar70 = auVar46._0_16_;
        uVar13 = uVar13 + 1;
        bVar23 = uVar13 < uVar21;
      } while (uVar13 != uVar21);
    }
LAB_01a4dd4a:
    if (uVar11 < uVar2) {
      uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
      uVar16 = (ulong)uVar3;
      if (uVar20 + 3 < (ulong)uVar3) {
        uVar16 = uVar20 + 3;
      }
      pBVar22 = (this->super_GridMesh).vertices.items;
      auVar50 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar46 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      bVar23 = true;
      auVar74._8_4_ = 0xddccb9a2;
      auVar74._0_8_ = 0xddccb9a2ddccb9a2;
      auVar74._12_4_ = 0xddccb9a2;
      auVar52._8_4_ = 0x5dccb9a2;
      auVar52._0_8_ = 0x5dccb9a25dccb9a2;
      auVar52._12_4_ = 0x5dccb9a2;
      uVar13 = uVar12;
      do {
        if (uVar19 < uVar3) {
          sVar5 = pBVar22[(long)iVar7 + -1].super_RawBufferView.stride;
          pauVar8 = (undefined1 (*) [16])
                    (pBVar22[(long)iVar7 + -1].super_RawBufferView.ptr_ofs +
                    (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar13) *
                    sVar5);
          lVar17 = uVar16 - uVar20;
          do {
            auVar64 = auVar46._0_16_;
            auVar68 = auVar50._0_16_;
            auVar38 = *pauVar8;
            auVar62 = vcmpps_avx(auVar38,auVar74,6);
            auVar66 = vcmpps_avx(auVar38,auVar52,1);
            auVar62 = vandps_avx(auVar66,auVar62);
            uVar15 = vmovmskps_avx(auVar62);
            if ((~(byte)uVar15 & 7) != 0) {
              if (bVar23) {
                auVar64._8_4_ = 0xff800000;
                auVar64._0_8_ = 0xff800000ff800000;
                auVar64._12_4_ = 0xff800000;
                auVar68._8_4_ = 0x7f800000;
                auVar68._0_8_ = 0x7f8000007f800000;
                auVar68._12_4_ = 0x7f800000;
              }
              goto LAB_01a4de13;
            }
            auVar62 = vminps_avx(auVar68,auVar38);
            auVar50 = ZEXT1664(auVar62);
            auVar38 = vmaxps_avx(auVar64,auVar38);
            auVar46 = ZEXT1664(auVar38);
            pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
            lVar17 = lVar17 + -1;
          } while (lVar17 != 0);
        }
        auVar64 = auVar46._0_16_;
        auVar68 = auVar50._0_16_;
        uVar13 = uVar13 + 1;
        bVar23 = uVar13 < uVar21;
      } while (uVar13 != uVar21);
    }
LAB_01a4de13:
    auVar38 = vmaxss_avx(ZEXT416((uint)(fVar24 - fVar31)),ZEXT816(0) << 0x40);
    fVar31 = auVar38._0_4_;
    fVar24 = 1.0 - fVar31;
    auVar57._0_4_ = auVar72._0_4_ * fVar31;
    auVar57._4_4_ = auVar72._4_4_ * fVar31;
    auVar57._8_4_ = auVar72._8_4_ * fVar31;
    auVar57._12_4_ = auVar72._12_4_ * fVar31;
    auVar55._4_4_ = fVar24;
    auVar55._0_4_ = fVar24;
    auVar55._8_4_ = fVar24;
    auVar55._12_4_ = fVar24;
    auVar48 = vfmadd213ps_fma(auVar49,auVar55,auVar57);
    auVar35._0_4_ = auVar70._0_4_ * fVar31;
    auVar35._4_4_ = auVar70._4_4_ * fVar31;
    auVar35._8_4_ = auVar70._8_4_ * fVar31;
    auVar35._12_4_ = auVar70._12_4_ * fVar31;
    auVar44 = vfmadd213ps_fma(auVar45,auVar55,auVar35);
    auVar38 = vmaxss_avx(ZEXT416((uint)(fVar32 - fVar25)),ZEXT816(0) << 0x40);
    fVar25 = auVar38._0_4_;
    fVar24 = 1.0 - fVar25;
    auVar56._0_4_ = auVar68._0_4_ * fVar25;
    auVar56._4_4_ = auVar68._4_4_ * fVar25;
    auVar56._8_4_ = auVar68._8_4_ * fVar25;
    auVar56._12_4_ = auVar68._12_4_ * fVar25;
    auVar53._4_4_ = fVar24;
    auVar53._0_4_ = fVar24;
    auVar53._8_4_ = fVar24;
    auVar53._12_4_ = fVar24;
    aVar40 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar39,auVar53,auVar56);
    auVar36._0_4_ = auVar64._0_4_ * fVar25;
    auVar36._4_4_ = auVar64._4_4_ * fVar25;
    auVar36._8_4_ = auVar64._8_4_ * fVar25;
    auVar36._12_4_ = auVar64._12_4_ * fVar25;
    aVar30 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar29,auVar53,auVar36);
    if ((int)(iVar9 + 1U) < iVar10) {
      uVar16 = (ulong)(iVar9 + 1U);
      auVar37._8_4_ = 0x7f800000;
      auVar37._0_8_ = 0x7f8000007f800000;
      auVar37._12_4_ = 0x7f800000;
      auVar58._8_4_ = 0xff800000;
      auVar58._0_8_ = 0xff800000ff800000;
      auVar58._12_4_ = 0xff800000;
      auVar61._8_4_ = 0xddccb9a2;
      auVar61._0_8_ = 0xddccb9a2ddccb9a2;
      auVar61._12_4_ = 0xddccb9a2;
      auVar65._8_4_ = 0x5dccb9a2;
      auVar65._0_8_ = 0x5dccb9a25dccb9a2;
      auVar65._12_4_ = 0x5dccb9a2;
      auVar38 = auVar44;
      auVar45 = auVar48;
      do {
        auVar49 = auVar37;
        auVar29 = auVar58;
        if (uVar11 < uVar2) {
          uVar3 = *(ushort *)(lVar4 + 8 + lVar18);
          uVar13 = (ulong)uVar3;
          if (uVar20 + 3 < (ulong)uVar3) {
            uVar13 = uVar20 + 3;
          }
          pBVar22 = (this->super_GridMesh).vertices.items + uVar16;
          bVar23 = true;
          auVar46 = ZEXT1664(auVar58);
          auVar50 = ZEXT1664(auVar37);
          uVar14 = uVar12;
          do {
            if (uVar19 < uVar3) {
              sVar5 = (pBVar22->super_RawBufferView).stride;
              pauVar8 = (undefined1 (*) [16])
                        ((pBVar22->super_RawBufferView).ptr_ofs +
                        (*(uint *)(lVar4 + lVar18) + uVar20 + *(uint *)(lVar4 + 4 + lVar18) * uVar14
                        ) * sVar5);
              lVar17 = uVar13 - uVar20;
              do {
                auVar49 = *pauVar8;
                auVar29 = vcmpps_avx(auVar49,auVar61,6);
                auVar39 = vcmpps_avx(auVar49,auVar65,1);
                auVar29 = vandps_avx(auVar29,auVar39);
                uVar15 = vmovmskps_avx(auVar29);
                if ((~(byte)uVar15 & 7) != 0) {
                  auVar49 = auVar37;
                  auVar29 = auVar58;
                  if (!bVar23) {
                    auVar49 = auVar50._0_16_;
                    auVar29 = auVar46._0_16_;
                  }
                  goto LAB_01a4df95;
                }
                auVar29 = vminps_avx(auVar50._0_16_,auVar49);
                auVar50 = ZEXT1664(auVar29);
                auVar49 = vmaxps_avx(auVar46._0_16_,auVar49);
                auVar46 = ZEXT1664(auVar49);
                pauVar8 = (undefined1 (*) [16])(*pauVar8 + sVar5);
                lVar17 = lVar17 + -1;
              } while (lVar17 != 0);
            }
            uVar14 = uVar14 + 1;
            bVar23 = uVar14 < uVar21;
            auVar49 = auVar50._0_16_;
            auVar29 = auVar46._0_16_;
          } while (uVar14 != uVar21);
        }
LAB_01a4df95:
        fVar25 = ((float)(int)uVar16 / fVar1 - fVar33) / (fVar54 - fVar33);
        fVar24 = 1.0 - fVar25;
        auVar71._0_4_ = aVar40.m128[0] * fVar25;
        fVar41 = aVar40.m128[1];
        auVar71._4_4_ = fVar41 * fVar25;
        fVar42 = aVar40.m128[2];
        auVar71._8_4_ = fVar42 * fVar25;
        fVar43 = aVar40.m128[3];
        auVar71._12_4_ = fVar43 * fVar25;
        auVar69._4_4_ = fVar24;
        auVar69._0_4_ = fVar24;
        auVar69._8_4_ = fVar24;
        auVar69._12_4_ = fVar24;
        auVar39 = vfmadd231ps_fma(auVar71,auVar69,auVar45);
        auVar49 = vsubps_avx(auVar49,auVar39);
        auVar28._0_4_ = aVar30.m128[0] * fVar25;
        fVar24 = aVar30.m128[1];
        auVar28._4_4_ = fVar24 * fVar25;
        fVar31 = aVar30.m128[2];
        auVar28._8_4_ = fVar31 * fVar25;
        fVar32 = aVar30.m128[3];
        auVar28._12_4_ = fVar32 * fVar25;
        auVar39 = vfmadd231ps_fma(auVar28,auVar38,auVar69);
        auVar39 = vsubps_avx(auVar29,auVar39);
        auVar29 = vminps_avx(auVar49,ZEXT816(0) << 0x40);
        auVar49 = vmaxps_avx(auVar39,ZEXT816(0) << 0x40);
        auVar48._0_4_ = auVar45._0_4_ + auVar29._0_4_;
        auVar48._4_4_ = auVar45._4_4_ + auVar29._4_4_;
        auVar48._8_4_ = auVar45._8_4_ + auVar29._8_4_;
        auVar48._12_4_ = auVar45._12_4_ + auVar29._12_4_;
        aVar40._0_4_ = aVar40.m128[0] + auVar29._0_4_;
        aVar40._4_4_ = fVar41 + auVar29._4_4_;
        aVar40._8_4_ = fVar42 + auVar29._8_4_;
        aVar40._12_4_ = fVar43 + auVar29._12_4_;
        auVar44._0_4_ = auVar38._0_4_ + auVar49._0_4_;
        auVar44._4_4_ = auVar38._4_4_ + auVar49._4_4_;
        auVar44._8_4_ = auVar38._8_4_ + auVar49._8_4_;
        auVar44._12_4_ = auVar38._12_4_ + auVar49._12_4_;
        aVar30._0_4_ = aVar30.m128[0] + auVar49._0_4_;
        aVar30._4_4_ = fVar24 + auVar49._4_4_;
        aVar30._8_4_ = fVar31 + auVar49._8_4_;
        aVar30._12_4_ = fVar32 + auVar49._12_4_;
        uVar16 = uVar16 + 1;
        auVar38 = auVar44;
        auVar45 = auVar48;
      } while (iVar10 != (int)uVar16);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar48;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar44;
  }
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar40;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar30;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t buildID, const BBox1f& time_range, const SubGridBuildData * const sgrids) const override {
        const SubGridBuildData &subgrid = sgrids[buildID];                      
        const unsigned int primID = subgrid.primID;
        const size_t x = subgrid.x();
        const size_t y = subgrid.y();
        return linearBounds(grid(primID),x,y,time_range);
      }